

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
::~BaseDictionary(BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                  *this)

{
  int **ppiVar1;
  WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
  **ppWVar2;
  BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  ppiVar1 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  if (*ppiVar1 != (int *)0x0) {
    ppiVar1 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    DeleteBuckets(this,*ppiVar1,this->bucketCount);
  }
  ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefValueDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  if (*ppWVar2 !=
      (WeakRefValueDictionaryEntry<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
       *)0x0) {
    ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefValueDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    DeleteEntries(this,*ppWVar2,this->size);
  }
  return;
}

Assistant:

~BaseDictionary()
        {
            if (buckets)
            {
                DeleteBuckets(buckets, bucketCount);
            }

            if (entries)
            {
                DeleteEntries(entries, size);
            }
        }